

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

void resume(lua_State *L,void *ud)

{
  byte *pbVar1;
  lua_KFunction p_Var2;
  long lVar3;
  int nres;
  CallInfo *pCVar4;
  StkId pSVar5;
  
  nres = *ud;
  pSVar5 = (StkId)((L->top).offset + (long)nres * -0x10);
  if (L->status != '\0') {
    pCVar4 = L->ci;
    L->status = '\0';
    p_Var2 = (pCVar4->u).c.k;
    if ((pCVar4->callstatus & 0x8000) == 0) {
      (pCVar4->u).l.savedpc = (Instruction *)(p_Var2 + -4);
      (L->top).p = pSVar5;
      luaV_execute(L,pCVar4);
    }
    else {
      if (p_Var2 != (lua_KFunction)0x0) {
        nres = (*p_Var2)(L,1,(pCVar4->u).c.ctx);
      }
      luaD_poscall(L,pCVar4,nres);
    }
    unroll(L,pCVar4);
    return;
  }
  pSVar5 = pSVar5 + -1;
  if (199 < (L->nCcalls & 0xfff8)) {
    if ((long)(L->stack_last).p - (L->top).offset < 0x10) {
      lVar3 = (L->stack).offset;
      luaD_growstack(L,0,1);
      pSVar5 = (StkId)(((long)pSVar5 - lVar3) + (long)(L->stack).p);
    }
    luaE_checkcstack(L);
  }
  pCVar4 = luaD_precall(L,pSVar5,-1);
  if (pCVar4 != (CallInfo *)0x0) {
    pbVar1 = (byte *)((long)&pCVar4->callstatus + 2);
    *pbVar1 = *pbVar1 | 1;
    luaV_execute(L,pCVar4);
    return;
  }
  return;
}

Assistant:

static void resume (lua_State *L, void *ud) {
  int n = *(cast(int*, ud));  /* number of arguments */
  StkId firstArg = L->top.p - n;  /* first argument */
  CallInfo *ci = L->ci;
  if (L->status == LUA_OK)  /* starting a coroutine? */
    ccall(L, firstArg - 1, LUA_MULTRET, 0);  /* just call its body */
  else {  /* resuming from previous yield */
    lua_assert(L->status == LUA_YIELD);
    L->status = LUA_OK;  /* mark that it is running (again) */
    if (isLua(ci)) {  /* yielded inside a hook? */
      /* undo increment made by 'luaG_traceexec': instruction was not
         executed yet */
      lua_assert(ci->callstatus & CIST_HOOKYIELD);
      ci->u.l.savedpc--;
      L->top.p = firstArg;  /* discard arguments */
      luaV_execute(L, ci);  /* just continue running Lua code */
    }
    else {  /* 'common' yield */
      if (ci->u.c.k != NULL) {  /* does it have a continuation function? */
        lua_unlock(L);
        n = (*ci->u.c.k)(L, LUA_YIELD, ci->u.c.ctx); /* call continuation */
        lua_lock(L);
        api_checknelems(L, n);
      }
      luaD_poscall(L, ci, n);  /* finish 'luaD_call' */
    }
    unroll(L, NULL);  /* run continuation */
  }
}